

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O1

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmGeneratedFileStream depFileStream;
  string local_298;
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  size_type local_260;
  pointer local_258;
  undefined8 local_250;
  undefined8 local_248;
  char *local_240;
  undefined8 local_238;
  
  if (this->Verbose == true) {
    local_278._0_8_ = (_func_int **)0x1a;
    local_278._8_8_ = "Clearing dependencies in \"";
    local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_258 = (file->_M_dataplus)._M_p;
    local_260 = file->_M_string_length;
    local_250 = 0;
    local_248 = 3;
    local_240 = "\".\n";
    local_238 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_278;
    cmCatViews(&local_298,views);
    cmSystemTools::Stdout(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,file,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "# Empty dependencies file\n# This may be replaced when dependencies are built.\n",0x4e
            );
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file) const
{
  // Print verbose output.
  if (this->Verbose) {
    cmSystemTools::Stdout(
      cmStrCat("Clearing dependencies in \"", file, "\".\n"));
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                   "# This may be replaced when dependencies are built.\n";
}